

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O3

void __thiscall
TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeMallocByTemporarlySwitchingOffMalloc_TestShell
::
~TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeMallocByTemporarlySwitchingOffMalloc_TestShell
          (TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeMallocByTemporarlySwitchingOffMalloc_TestShell
           *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MemoryLeakOverridesToBeUsedInProductionCode, UseNativeMallocByTemporarlySwitchingOffMalloc)
{
    size_t memLeaks = memLeakDetector->totalMemoryLeaks(mem_leak_period_checking);
#ifdef CPPUTEST_USE_MALLOC_MACROS
    #undef malloc
    #undef free
#endif

#if CPPUTEST_USE_STD_C_LIB
    void* memory = malloc(10);
    LONGS_EQUAL(memLeaks, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking));
    free (memory);
#else
    void* memory = PlatformSpecificMalloc(10);
    LONGS_EQUAL(memLeaks, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking));
    PlatformSpecificFree (memory);
#endif

#ifdef CPPUTEST_USE_MALLOC_MACROS
#include "CppUTest/MemoryLeakDetectorMallocMacros.h"
#endif
}